

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

char * helicsFederateWaitCommand(HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  FedObject *pFVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  FedObject *fedObj;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  HelicsFederate in_stack_ffffffffffffffa8;
  Federate *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  pFVar2 = helics::getFedObject(in_stack_ffffffffffffffa8,(HelicsError *)in_stack_ffffffffffffffa0);
  if (pFVar2 == (FedObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&in_stack_ffffffffffffffa0->first);
  }
  else {
    std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bf09e);
    helics::Federate::waitCommand_abi_cxx11_(in_stack_ffffffffffffffb8);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bf0b5
                      );
    if (bVar1) {
      local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str(&in_stack_ffffffffffffffa0->first);
    }
    else {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(in_stack_ffffffffffffffa0,
                  (type)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str(&in_stack_ffffffffffffffa0->first);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_ffffffffffffffa0);
  }
  return local_8;
}

Assistant:

const char* helicsFederateWaitCommand(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);

    if (fedObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    auto res = fedObj->fedptr->waitCommand();
    if (res.first.empty()) {
        return gHelicsEmptyStr.c_str();
    }
    fedObj->commandBuffer = std::move(res);
    return fedObj->commandBuffer.first.c_str();
}